

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

size_t revealSeedsSize(uint numNodes,uint16_t *hideList,size_t hideListSize,
                      picnic_instance_t *params)

{
  _Bool _Var1;
  uint *__ptr;
  long in_RCX;
  size_t *in_RSI;
  undefined4 in_EDI;
  uint *revealed;
  size_t numNodesRevealed;
  tree_t tree;
  undefined8 in_stack_ffffffffffffffb0;
  long lVar2;
  tree_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_fffffffffffffff0;
  uint16_t *in_stack_fffffffffffffff8;
  size_t sVar3;
  
  _Var1 = createTree(in_stack_ffffffffffffffb8,(uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                     (uint)in_stack_ffffffffffffffb0);
  if (_Var1) {
    lVar2 = 0;
    __ptr = getRevealedNodes((tree_t *)revealed,in_stack_fffffffffffffff8,
                             CONCAT44(in_EDI,in_stack_fffffffffffffff0),in_RSI);
    clearTree((tree_t *)0x158a16);
    free(__ptr);
    sVar3 = lVar2 * (ulong)*(byte *)(in_RCX + 7);
  }
  else {
    sVar3 = 0xffffffffffffffff;
  }
  return sVar3;
}

Assistant:

size_t revealSeedsSize(unsigned int numNodes, uint16_t* hideList, size_t hideListSize,
                       const picnic_instance_t* params) {
  tree_t tree;
  if (!createTree(&tree, numNodes, 0)) {
    return SIZE_MAX;
  }

  size_t numNodesRevealed = 0;
  unsigned int* revealed  = getRevealedNodes(&tree, hideList, hideListSize, &numNodesRevealed);
  clearTree(&tree);
  free(revealed);
  return numNodesRevealed * params->seed_size;
}